

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

InlineResult
soul::Optimisations::inlineNextCall
          (Program *program,Function *parentFunction,Function *functionToInline)

{
  pointer ppVar1;
  bool bVar2;
  Statement *object;
  FunctionCall *pFVar3;
  size_t blockIndex;
  ulong blockIndex_00;
  pool_ptr<soul::heart::FunctionCall> call;
  Iterator __begin3;
  
  blockIndex_00 = 0;
  do {
    ppVar1 = (parentFunction->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(parentFunction->blocks).
                      super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3) <=
        blockIndex_00) {
      return noneFound;
    }
    __begin3.object = ((ppVar1[blockIndex_00].object)->statements).firstObject;
    while (__begin3.object != (Statement *)0x0) {
      object = LinkedList<soul::heart::Statement>::Iterator::operator*(&__begin3);
      cast<soul::heart::FunctionCall,soul::heart::Statement>((soul *)&call,object);
      if ((call.object != (FunctionCall *)0x0) &&
         (pFVar3 = pool_ptr<soul::heart::FunctionCall>::operator->(&call),
         (pFVar3->function).object == functionToInline)) {
        pFVar3 = pool_ptr<soul::heart::FunctionCall>::operator*(&call);
        bVar2 = heart::Utilities::canFunctionBeInlined(program,parentFunction,pFVar3);
        if (bVar2) {
          pFVar3 = pool_ptr<soul::heart::FunctionCall>::operator*(&call);
          makeFunctionCallInline(program,parentFunction,blockIndex_00,pFVar3);
          return ok;
        }
        return failed;
      }
      LinkedList<soul::heart::Statement>::Iterator::operator++(&__begin3);
    }
    blockIndex_00 = blockIndex_00 + 1;
  } while( true );
}

Assistant:

static InlineResult inlineNextCall (Program& program, heart::Function& parentFunction, heart::Function& functionToInline)
    {
        for (size_t blockIndex = 0; blockIndex < parentFunction.blocks.size(); ++blockIndex)
        {
            for (auto s : parentFunction.blocks[blockIndex]->statements)
            {
                if (auto call = cast<heart::FunctionCall> (*s))
                {
                    if (call->function == functionToInline)
                    {
                        if (! heart::Utilities::canFunctionBeInlined (program, parentFunction, *call))
                            return InlineResult::failed;

                        makeFunctionCallInline (program, parentFunction, blockIndex, *call);
                        return InlineResult::ok;
                    }
                }
            }
        }

        return InlineResult::noneFound;
    }